

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int mg_dns_parse_record_data
              (mg_dns_message *msg,mg_dns_resource_record *rr,void *data,size_t data_len)

{
  char *__src;
  
  if (rr->rtype == 5) {
    mg_dns_uncompress_name(msg,&rr->rdata,(char *)data,(int)data_len);
  }
  else {
    if (rr->rtype != 1) {
      return -1;
    }
    if (data_len < 4) {
      return -1;
    }
    __src = (rr->rdata).p;
    if ((msg->pkt).p + (msg->pkt).len < __src + data_len) {
      return -1;
    }
    memcpy(data,__src,data_len);
  }
  return 0;
}

Assistant:

int mg_dns_parse_record_data(struct mg_dns_message *msg,
                             struct mg_dns_resource_record *rr, void *data,
                             size_t data_len) {
    switch (rr->rtype) {
        case MG_DNS_A_RECORD:
            if (data_len < sizeof(struct in_addr)) {
                return -1;
            }
            if (rr->rdata.p + data_len > msg->pkt.p + msg->pkt.len) {
                return -1;
            }
            memcpy(data, rr->rdata.p, data_len);
            return 0;
#ifdef MG_ENABLE_IPV6
                                                                                                                                case MG_DNS_AAAA_RECORD:
      if (data_len < sizeof(struct in6_addr)) {
        return -1; /* LCOV_EXCL_LINE */
      }
      memcpy(data, rr->rdata.p, data_len);
      return 0;
#endif
        case MG_DNS_CNAME_RECORD:
            mg_dns_uncompress_name(msg, &rr->rdata, (char *) data, data_len);
            return 0;
    }

    return -1;
}